

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# challenge.c
# Opt level: O2

void invisible_hero(dw_rom *rom)

{
  undefined8 in_stack_fffffffffffffef8;
  uint uVar1;
  undefined8 in_stack_ffffffffffffff00;
  uint uVar2;
  undefined8 in_stack_ffffffffffffff08;
  uint uVar3;
  undefined8 in_stack_ffffffffffffff10;
  uint uVar4;
  undefined8 in_stack_ffffffffffffff18;
  uint uVar5;
  undefined8 in_stack_ffffffffffffff20;
  uint uVar6;
  undefined8 in_stack_ffffffffffffff28;
  uint uVar7;
  undefined8 in_stack_ffffffffffffff30;
  uint uVar8;
  undefined8 in_stack_ffffffffffffff38;
  uint uVar9;
  undefined8 in_stack_ffffffffffffff40;
  uint uVar10;
  undefined8 in_stack_ffffffffffffff48;
  uint uVar11;
  undefined8 in_stack_ffffffffffffff50;
  uint uVar12;
  undefined8 in_stack_ffffffffffffff58;
  uint uVar13;
  undefined8 in_stack_ffffffffffffff60;
  uint uVar14;
  undefined8 in_stack_ffffffffffffff68;
  uint uVar15;
  undefined8 in_stack_ffffffffffffff70;
  uint uVar16;
  undefined8 in_stack_ffffffffffffff78;
  uint uVar17;
  undefined8 in_stack_ffffffffffffff80;
  uint uVar18;
  undefined8 in_stack_ffffffffffffff88;
  uint uVar19;
  undefined8 in_stack_ffffffffffffff90;
  uint uVar20;
  undefined8 in_stack_ffffffffffffff98;
  uint uVar21;
  undefined8 in_stack_ffffffffffffffa0;
  uint uVar22;
  undefined8 in_stack_ffffffffffffffa8;
  uint uVar23;
  undefined8 in_stack_ffffffffffffffb0;
  uint uVar24;
  undefined8 in_stack_ffffffffffffffb8;
  uint uVar25;
  undefined8 in_stack_ffffffffffffffc0;
  uint uVar26;
  undefined8 in_stack_ffffffffffffffc8;
  uint uVar27;
  undefined8 in_stack_ffffffffffffffd0;
  uint uVar28;
  undefined8 in_stack_ffffffffffffffd8;
  uint uVar29;
  undefined8 uVar30;
  
  uVar1 = (uint)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  uVar2 = (uint)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  uVar3 = (uint)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  uVar4 = (uint)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  uVar5 = (uint)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  uVar6 = (uint)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  uVar7 = (uint)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  uVar8 = (uint)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  uVar9 = (uint)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  uVar10 = (uint)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  uVar11 = (uint)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  uVar12 = (uint)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  uVar13 = (uint)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  uVar14 = (uint)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  uVar15 = (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  uVar16 = (uint)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  uVar17 = (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  uVar18 = (uint)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  uVar19 = (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  uVar20 = (uint)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  uVar21 = (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  uVar22 = (uint)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  uVar23 = (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  uVar24 = (uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  uVar25 = (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  uVar26 = (uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  uVar27 = (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  uVar28 = (uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  uVar29 = (uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  if ((rom->flags[9] & 0xc) != 0) {
    puts("Thou shall not see thyself...");
    vpatch(rom,0x12200,0x20,0,0,0,(ulong)uVar1 << 0x20,(ulong)uVar2 << 0x20,(ulong)uVar3 << 0x20,
           (ulong)uVar4 << 0x20,(ulong)uVar5 << 0x20,(ulong)uVar6 << 0x20,(ulong)uVar7 << 0x20,
           (ulong)uVar8 << 0x20,(ulong)uVar9 << 0x20,(ulong)uVar10 << 0x20,(ulong)uVar11 << 0x20,
           (ulong)uVar12 << 0x20,(ulong)uVar13 << 0x20,(ulong)uVar14 << 0x20,(ulong)uVar15 << 0x20,
           (ulong)uVar16 << 0x20,(ulong)uVar17 << 0x20,(ulong)uVar18 << 0x20,(ulong)uVar19 << 0x20,
           (ulong)uVar20 << 0x20,(ulong)uVar21 << 0x20,(ulong)uVar22 << 0x20,(ulong)uVar23 << 0x20,
           (ulong)uVar24 << 0x20,(ulong)uVar25 << 0x20,(ulong)uVar26 << 0x20,(ulong)uVar27 << 0x20,
           (ulong)uVar28 << 0x20,(ulong)uVar29 << 0x20);
    uVar30 = 0;
    vpatch(rom,0x12240,0x5f,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,
           0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12300,0x80,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,
           0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12400,0x180,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0
           ,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12600,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,uVar30);
    vpatch(rom,0x12620,0xf,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12640,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12660,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12710,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12730,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12750,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12770,0xf,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12800,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12820,0xf,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12840,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12860,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12910,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12930,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12950,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12970,0x90,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,
           0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12a20,0x70,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,
           0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12aa0,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12ac0,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12ae0,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12b50,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12b90,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
    vpatch(rom,0x12bd0,0x10,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
  }
  return;
}

Assistant:

void invisible_hero(dw_rom *rom)
{
    if (!INVISIBLE_HERO(rom))
        return;

    printf("Thou shall not see thyself...\n");

    vpatch(rom, 0x12200,   32,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12240,   95,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12300,  128,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12400,  384,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12600,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12620,   15,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12640,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12660,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12710,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12730,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12750,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12770,   15,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12800,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12820,   15,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12840,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12860,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12910,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12930,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12950,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12970,  144,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12a20,  112,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12aa0,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12ac0,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12ae0,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12b50,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12b90,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
    vpatch(rom, 0x12bd0,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00);
}